

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O0

int idaLsPSolve(void *ida_mem,N_Vector r,N_Vector z,sunrealtype tol,int lr)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_XMM0_Qa;
  int retval;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  int local_4;
  
  local_4 = idaLs_AccessLMem(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                             (IDAMem *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                             ,(IDALsMem *)0x11bfb8);
  if (local_4 == 0) {
    local_4 = (**(code **)(in_stack_ffffffffffffffc0 + 0x108))
                        (*(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0x2a8),
                         *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0x2b8),in_XMM0_Qa,
                         *(undefined8 *)(in_stack_ffffffffffffffc0 + 0x48),
                         *(undefined8 *)(in_stack_ffffffffffffffc0 + 0x50),
                         *(undefined8 *)(in_stack_ffffffffffffffc0 + 0x58),in_RSI,in_RDX,
                         *(undefined8 *)(in_stack_ffffffffffffffc0 + 0x118));
    *(long *)(in_stack_ffffffffffffffc0 + 0x98) = *(long *)(in_stack_ffffffffffffffc0 + 0x98) + 1;
  }
  return local_4;
}

Assistant:

int idaLsPSolve(void* ida_mem, N_Vector r, N_Vector z, sunrealtype tol,
                SUNDIALS_MAYBE_UNUSED int lr)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* call the user-supplied psolve routine, and accumulate count */
  retval = idals_mem->psolve(IDA_mem->ida_tn, idals_mem->ycur, idals_mem->ypcur,
                             idals_mem->rcur, r, z, IDA_mem->ida_cj, tol,
                             idals_mem->pdata);
  idals_mem->nps++;
  return (retval);
}